

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O2

void replay_hash(ResourceTag tag,Hash hash,DatabaseInterface *db_iface,StateReplayer *replayer,
                StateCreatorInterface *iface,
                vector<unsigned_char,_std::allocator<unsigned_char>_> *state_json)

{
  pointer buffer;
  bool bVar1;
  int iVar2;
  size_t state_json_size;
  
  iVar2 = (*db_iface->_vptr_DatabaseInterface[3])(db_iface,tag,hash,&state_json_size,0,0);
  if ((char)iVar2 != '\0') {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(state_json,state_json_size);
    iVar2 = (*db_iface->_vptr_DatabaseInterface[3])
                      (db_iface,tag,hash,&state_json_size,
                       (state_json->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_start,0);
    if ((char)iVar2 != '\0') {
      buffer = (state_json->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_start;
      bVar1 = Fossilize::StateReplayer::parse
                        (replayer,iface,db_iface,buffer,
                         (long)(state_json->
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)buffer);
      if (!bVar1) {
        fprintf(_stderr,"Fossilize ERROR: Failed to parse blob (tag: %d, hash: 0x%016lx).\n",tag,
                hash);
        fflush(_stderr);
      }
      return;
    }
  }
  fwrite("Fossilize ERROR: Failed to load blob from cache.\n",0x31,1,_stderr);
  fflush(_stderr);
  exit(1);
}

Assistant:

static void replay_hash(ResourceTag tag, Hash hash, DatabaseInterface &db_iface,
                        StateReplayer &replayer, StateCreatorInterface &iface,
                        vector<uint8_t> &state_json)
{
	size_t state_json_size;
	if (!db_iface.read_entry(tag, hash, &state_json_size, nullptr, 0))
	{
		LOGE("Failed to load blob from cache.\n");
		exit(EXIT_FAILURE);
	}

	state_json.resize(state_json_size);

	if (!db_iface.read_entry(tag, hash, &state_json_size, state_json.data(), 0))
	{
		LOGE("Failed to load blob from cache.\n");
		exit(EXIT_FAILURE);
	}

	if (!replayer.parse(iface, &db_iface, state_json.data(), state_json.size()))
		LOGE("Failed to parse blob (tag: %d, hash: 0x%016" PRIx64 ").\n", tag, hash);
}